

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerStream.cpp
# Opt level: O0

void __thiscall WorkerStream::start(WorkerStream *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_40;
  _Self local_38;
  it_type it_1;
  bool not_done;
  _Self local_20;
  _Self local_18;
  it_type it;
  WorkerStream *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
       ::begin(&this->m_flows);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
         ::end(&this->m_flows);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
             ::operator->(&local_18);
    WorkerFlow::ready(ppVar2->second->flow);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
    ::operator++(&local_18,0);
  }
  it_1._M_node._7_1_ = 1;
  while ((it_1._M_node._7_1_ & 1) != 0) {
    it_1._M_node._7_1_ = 0;
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
         ::begin(&this->m_flows);
    while( true ) {
      local_40._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
           ::end(&this->m_flows);
      bVar1 = std::operator!=(&local_38,&local_40);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
               ::operator->(&local_38);
      if ((ppVar2->second->stopped & 1U) == 0) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
                 ::operator->(&local_38);
        bVar1 = WorkerFlow::work(ppVar2->second->flow);
        if (bVar1) {
          it_1._M_node._7_1_ = 1;
        }
        else {
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
                   ::operator->(&local_38);
          ppVar2->second->stopped = true;
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>
      ::operator++(&local_38,0);
    }
  }
  return;
}

Assistant:

void WorkerStream::start() 
{
    typedef std::map<std::string, WorkerWrapper*>::iterator it_type;

    // tell each worker that it is ready to begin working.
    for (it_type it = m_flows.begin(); it != m_flows.end(); it++) {
        it->second->flow->ready();
    }

    // this flag will tell us if some flow isn't stopped, and iterate again.
    bool not_done = true;

    while (not_done) {
        not_done = false;

        // loop each flow.
        for (it_type it = m_flows.begin(); it != m_flows.end(); it++) {
            // if the flow is stopped, skip it.
            if (it->second->stopped) {
                continue;
            }

            // if the flow work() returns true, then there's more work to be
            // done.
            if (it->second->flow->work()) {
                // set the flag to true to iterate again.
                not_done = true;
            } else {
                // set this flow as stopped, in order to skip it.
                it->second->stopped = true;
            }
        }
    }
}